

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O2

void __thiscall
re2c::Skeleton::Skeleton
          (Skeleton *this,dfa_t *dfa,charset_t *cs,rules_t *rs,string *dfa_name,string *dfa_cond,
          uint32_t dfa_line)

{
  ulong uVar1;
  uint uVar2;
  dfa_state_t *pdVar3;
  size_t *psVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  uint32_t uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Node *pNVar16;
  uint uVar17;
  ulong uVar18;
  size_t sStack_a0;
  vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
  arcs;
  pair<re2c::Node_*,_unsigned_int> local_40;
  
  std::__cxx11::string::string((string *)this,(string *)dfa_name);
  std::__cxx11::string::string((string *)&this->cond,(string *)dfa_cond);
  this->line = dfa_line;
  sVar12 = (long)(dfa->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(dfa->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar10 = sVar12 + 1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar10;
  this->nodes_count = sVar12;
  uVar15 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0xb0),8) == 0) {
    uVar15 = SUB168(auVar5 * ZEXT816(0xb0),0) | 8;
  }
  puVar9 = (ulong *)operator_new__(uVar15);
  *puVar9 = uVar10;
  if (uVar10 != 0) {
    lVar13 = 0;
    pNVar16 = (Node *)(puVar9 + 1);
    do {
      Node::Node(pNVar16);
      lVar13 = lVar13 + -0xb0;
      pNVar16 = pNVar16 + 1;
    } while (sVar12 * -0xb0 + -0xb0 != lVar13);
  }
  this->nodes = (Node *)(puVar9 + 1);
  this->sizeof_key = 4;
  std::
  _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  ::_Rb_tree(&(this->rules)._M_t,&rs->_M_t);
  uVar15 = ((long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2) - 1;
  uVar10 = this->nodes_count;
  pNVar16 = this->nodes + uVar10;
  uVar18 = 0;
  do {
    if (uVar10 <= uVar18) {
      Node::calc_dist(this->nodes);
      uVar2 = this->nodes->dist;
      if (uVar2 == 0xfffffffe) {
        incond((string *)&arcs,&this->cond);
        error("DFA path %sis too long",
              arcs.
              super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&arcs);
        exit(1);
      }
      uVar14 = 0;
      for (uVar17 = 0; (ulong)uVar17 < this->nodes_count; uVar17 = uVar17 + 1) {
        arcs.
        super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(arcs.
                               super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               this->nodes[uVar17].rule.rank.value);
        bVar7 = rule_rank_t::is_none((rule_rank_t *)&arcs);
        if (((!bVar7) && (bVar7 = rule_rank_t::is_def((rule_rank_t *)&arcs), !bVar7)) &&
           (uVar8 = rule_rank_t::uint32((rule_rank_t *)&arcs), uVar14 <= uVar8)) {
          uVar14 = uVar8;
        }
      }
      uVar17 = uVar14 + 2;
      if (uVar14 + 2 < uVar2) {
        uVar17 = uVar2;
      }
      if (uVar17 < 0x100) {
        sStack_a0 = 1;
      }
      else {
        if (0xffff < uVar17) {
          return;
        }
        sStack_a0 = 2;
      }
      this->sizeof_key = sStack_a0;
      return;
    }
    pdVar3 = (dfa->states).
             super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar18];
    arcs.
    super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arcs.
    super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arcs.
    super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar10 = 0;
    while (uVar10 < uVar15) {
      psVar4 = pdVar3->arcs;
      sVar12 = psVar4[uVar10];
      uVar11 = uVar10;
      do {
        uVar1 = uVar11 + 1;
        uVar10 = uVar15;
        if (uVar15 <= uVar1) break;
        uVar6 = uVar11 + 1;
        uVar11 = uVar1;
        uVar10 = uVar1;
      } while (psVar4[uVar6] == sVar12);
      local_40.first = this->nodes + sVar12;
      if (sVar12 == 0xffffffffffffffff) {
        local_40.first = pNVar16;
      }
      local_40.second =
           (cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar10];
      std::
      vector<std::pair<re2c::Node*,unsigned_int>,std::allocator<std::pair<re2c::Node*,unsigned_int>>>
      ::emplace_back<std::pair<re2c::Node*,unsigned_int>>
                ((vector<std::pair<re2c::Node*,unsigned_int>,std::allocator<std::pair<re2c::Node*,unsigned_int>>>
                  *)&arcs,&local_40);
    }
    if ((((long)arcs.
                super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)arcs.
                super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x10) &&
        (arcs.
         super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         arcs.
         super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)) &&
       ((arcs.
         super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->first == pNVar16)) {
      arcs.
      super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           arcs.
           super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    Node::init(this->nodes + uVar18,(EVP_PKEY_CTX *)(ulong)pdVar3->ctx);
    std::
    _Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
    ::~_Vector_base((_Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                     *)&arcs);
    uVar18 = uVar18 + 1;
    uVar10 = this->nodes_count;
  } while( true );
}

Assistant:

Skeleton::Skeleton
	( const dfa_t &dfa
	, const charset_t &cs
	, const rules_t &rs
	, const std::string &dfa_name
	, const std::string &dfa_cond
	, uint32_t dfa_line
	)
	: name (dfa_name)
	, cond (dfa_cond)
	, line (dfa_line)
	, nodes_count (dfa.states.size())
	, nodes (new Node [nodes_count + 1]) // +1 for default state
	, sizeof_key (4)
	, rules (rs)
{
	const size_t nc = cs.size() - 1;

	// initialize skeleton nodes
	Node *nil = &nodes[nodes_count];
	for (size_t i = 0; i < nodes_count; ++i)
	{
		dfa_state_t *s = dfa.states[i];
		std::vector<std::pair<Node*, uint32_t> > arcs;
		for (size_t c = 0; c < nc;)
		{
			const size_t j = s->arcs[c];
			for (;++c < nc && s->arcs[c] == j;);
			Node *to = j == dfa_t::NIL
				? nil
				: &nodes[j];
			arcs.push_back(std::make_pair(to, cs[c]));
		}
		// all arcs go to default node => this node is final, drop arcs
		if (arcs.size() == 1 && arcs[0].first == nil)
		{
			arcs.clear();
		}
		nodes[i].init(s->ctx, s->rule, arcs);
	}

	// calculate maximal path length, check overflow
	nodes->calc_dist ();
	const uint32_t maxlen = nodes->dist;
	if (maxlen == Node::DIST_MAX)
	{
		error ("DFA path %sis too long", incond (cond).c_str ());
		exit (1);
	}

	// calculate maximal rule rank (disregarding default and none rules)
	uint32_t maxrule = 0;
	for (uint32_t i = 0; i < nodes_count; ++i)
	{
		const rule_rank_t r = nodes[i].rule.rank;
		if (!r.is_none () && !r.is_def ())
		{
			maxrule = std::max (maxrule, r.uint32 ());
		}
	}
	// two upper values reserved for default and none rules)
	maxrule += 2;

	// initialize size of key
	const uint32_t max = std::max (maxlen, maxrule);
	if (max <= std::numeric_limits<uint8_t>::max())
	{
		sizeof_key = 1;
	}
	else if (max <= std::numeric_limits<uint16_t>::max())
	{
		sizeof_key = 2;
	}
}